

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::selectFile(QFileDialog *this,QString *filename)

{
  bool bVar1;
  byte bVar2;
  QFileDialogPrivate *this_00;
  ulong uVar3;
  QFileDialogOptions *pQVar4;
  QItemSelectionModel *pQVar5;
  QModelIndex *this_01;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QModelIndex index;
  QString filenamePath;
  QFileInfo info;
  QString path;
  QUrl url;
  undefined4 in_stack_fffffffffffffe68;
  ComponentFormattingOption in_stack_fffffffffffffe6c;
  QFileDialogPrivate *in_stack_fffffffffffffe70;
  QChar in_stack_fffffffffffffe7e;
  ushort uVar6;
  QFileDialogPrivate *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  undefined5 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 in_stack_fffffffffffffe9e;
  byte bVar7;
  undefined1 in_stack_fffffffffffffe9f;
  byte bVar8;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  QDir local_d0 [8];
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  QUrl local_90;
  QStringBuilder<QString_&,_const_QString_&> local_88;
  undefined1 local_78 [24];
  QChar local_60;
  QChar local_5e [3];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QUrl local_40;
  QFileInfo local_38 [8];
  QUrl local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDialog *)0x74d975);
  bVar1 = QString::isEmpty((QString *)0x74d984);
  if (!bVar1) {
    bVar1 = QFileDialogPrivate::usingWidgets(in_stack_fffffffffffffe70);
    if (bVar1) {
      uVar3 = QDir::isRelativePath(in_RSI);
      if ((uVar3 & 1) == 0) {
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_b0,in_RSI);
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::absoluteDir();
        QDir::path();
        QDir::~QDir(local_d0);
        QFileSystemModel::rootPath();
        bVar1 = ::operator!=((QString *)in_stack_fffffffffffffe70,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        uVar6 = (ushort)bVar1 << 8;
        QString::~QString((QString *)0x74dcf0);
        if ((uVar6 & 0x100) != 0) {
          setDirectory((QFileDialog *)this_00,
                       (QString *)
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT15(in_stack_fffffffffffffe9d,
                                                  in_stack_fffffffffffffe98))));
        }
        QString::~QString((QString *)0x74dd19);
        QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
      }
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemModel::index((QString *)&local_100,(int)this_00->model);
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&this_00->qFileDialogUi);
      pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffe70);
      (**(code **)(*(long *)pQVar5 + 0x78))();
      bVar1 = QWidget::isVisible((QWidget *)0x74dda3);
      if (bVar1) {
        QFileDialogPrivate::lineEdit((QFileDialogPrivate *)0x74ddb3);
        bVar1 = QWidget::hasFocus((QWidget *)
                                  CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        if (bVar1) goto LAB_0074dec3;
      }
      this_01 = (QModelIndex *)QFileDialogPrivate::lineEdit((QFileDialogPrivate *)0x74ddcd);
      bVar1 = QModelIndex::isValid(this_01);
      bVar8 = 0;
      bVar7 = 0;
      bVar2 = 0;
      if (bVar1) {
        QModelIndex::data((QModelIndex *)
                          CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                          (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        bVar8 = 1;
        ::QVariant::toString();
      }
      else {
        QFileDialogPrivate::rootPath(in_stack_fffffffffffffe80);
        bVar7 = 1;
        QString::QString((QString *)this_01,
                         (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        bVar2 = 1;
        fileFromPath(in_RDI,(QString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88)
                    );
      }
      QLineEdit::setText((QLineEdit *)this_01,
                         (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QString::~QString((QString *)0x74de85);
      if ((bVar2 & 1) != 0) {
        QString::~QString((QString *)0x74de98);
      }
      if ((bVar7 & 1) != 0) {
        QString::~QString((QString *)0x74deab);
      }
      if ((bVar8 & 1) != 0) {
        ::QVariant::~QVariant(&local_28);
      }
    }
    else {
      local_30.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::QUrl(&local_30);
      QFileInfo::QFileInfo(local_38,in_RSI);
      bVar2 = QFileInfo::isRelative();
      QFileInfo::~QFileInfo(local_38);
      if ((bVar2 & 1) == 0) {
        QUrl::fromLocalFile((QString *)&local_90);
        QUrl::operator=((QUrl *)in_stack_fffffffffffffe70,
                        (QUrl *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QUrl::~QUrl(&local_90);
      }
      else {
        QSharedPointer<QFileDialogOptions>::operator->
                  ((QSharedPointer<QFileDialogOptions> *)0x74da0b);
        QFileDialogOptions::initialDirectory();
        QUrl::operator=((QUrl *)in_stack_fffffffffffffe70,
                        (QUrl *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QUrl::~QUrl(&local_40);
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe6c);
        QUrl::path((QFlags_conflict1 *)&local_58);
        QChar::QChar<char16_t,_true>(local_5e,L'/');
        uVar3 = QString::endsWith((QChar *)&local_58,(uint)(ushort)local_5e[0].ucs);
        if ((uVar3 & 1) == 0) {
          QChar::QChar<char16_t,_true>(&local_60,L'/');
          QString::operator+=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe7e);
        }
        local_88 = ::operator+((QString *)in_stack_fffffffffffffe70,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_const_QString_&> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QUrl::setPath((QString *)&local_30,(ParsingMode)local_78);
        QString::~QString((QString *)0x74db4d);
        QString::~QString((QString *)0x74db5a);
      }
      QFileDialogPrivate::selectFile_sys
                (in_stack_fffffffffffffe70,
                 (QUrl *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      pQVar4 = QSharedPointer<QFileDialogOptions>::operator->
                         ((QSharedPointer<QFileDialogOptions> *)0x74dbb3);
      memset(local_a8,0,0x18);
      QList<QUrl>::QList((QList<QUrl> *)0x74dbd9);
      QList<QUrl>::operator<<
                ((QList<QUrl> *)in_stack_fffffffffffffe70,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QFileDialogOptions::setInitiallySelectedFiles((QList_conflict2 *)pQVar4);
      QList<QUrl>::~QList((QList<QUrl> *)0x74dc08);
      QUrl::~QUrl(&local_30);
    }
  }
LAB_0074dec3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::selectFile(const QString &filename)
{
    Q_D(QFileDialog);
    if (filename.isEmpty())
        return;

    if (!d->usingWidgets()) {
        QUrl url;
        if (QFileInfo(filename).isRelative()) {
            url = d->options->initialDirectory();
            QString path = url.path();
            if (!path.endsWith(u'/'))
                path += u'/';
            url.setPath(path + filename);
        } else {
            url = QUrl::fromLocalFile(filename);
        }
        d->selectFile_sys(url);
        d->options->setInitiallySelectedFiles(QList<QUrl>() << url);
        return;
    }

    if (!QDir::isRelativePath(filename)) {
        QFileInfo info(filename);
        QString filenamePath = info.absoluteDir().path();

        if (d->model->rootPath() != filenamePath)
            setDirectory(filenamePath);
    }

    QModelIndex index = d->model->index(filename);
    d->qFileDialogUi->listView->selectionModel()->clear();
    if (!isVisible() || !d->lineEdit()->hasFocus())
        d->lineEdit()->setText(index.isValid() ? index.data().toString() : fileFromPath(d->rootPath(), filename));
}